

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_container.cpp
# Opt level: O1

bool __thiscall
cppnet::TimerContainer::InnerAddTimer
          (TimerContainer *this,shared_ptr<cppnet::TimerSlot> *ptr,uint32_t time)

{
  size_t *psVar1;
  TIME_UNIT tu;
  TimerSlot *this_00;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  uint uVar4;
  bool bVar5;
  uint16_t type;
  mapped_type *this_01;
  mapped_type *pmVar6;
  _List_node_base *p_Var7;
  uint uVar8;
  uint32_t left_time;
  undefined8 local_38;
  
  bVar5 = false;
  if (time <= this->_timer_max) {
    tu = this->_time_unit;
    local_38._4_4_ = time % tu;
    uVar8 = time / tu + this->_cur_time;
    uVar4 = this->_size;
    if ((uVar8 & 0xffff) < this->_size) {
      uVar4 = 0;
    }
    uVar8 = uVar8 - uVar4;
    if ((this->_sub_timer).super___shared_ptr<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr == (element_type *)0x0) {
      local_38._4_4_ = 0;
    }
    this_00 = (ptr->super___shared_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    type = TimeUnit2TimeType((TimerContainer *)(ulong)uVar4,tu);
    TimerSlot::SetCurIndex(this_00,(uint16_t)uVar8,type);
    TimerSlot::TimePass((ptr->super___shared_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr,time - local_38._4_4_);
    local_38 = CONCAT44(local_38._4_4_,uVar8) & 0xffffffff0000ffff;
    this_01 = std::__detail::
              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::map<unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::map<unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::map<unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::map<unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->_timer_wheel,(key_type *)&local_38);
    pmVar6 = std::
             map<unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>
             ::operator[](this_01,(key_type_conflict *)((long)&local_38 + 4));
    peVar2 = (ptr->super___shared_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    p_Var3 = (ptr->super___shared_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_weak_count = p_Var3->_M_weak_count + 1;
        UNLOCK();
      }
      else {
        p_Var3->_M_weak_count = p_Var3->_M_weak_count + 1;
      }
    }
    p_Var7 = (_List_node_base *)operator_new(0x20);
    p_Var7[1]._M_next = (_List_node_base *)peVar2;
    p_Var7[1]._M_prev = (_List_node_base *)p_Var3;
    std::__detail::_List_node_base::_M_hook(p_Var7);
    psVar1 = &(pmVar6->
              super__List_base<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
              )._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    bVar5 = Bitmap::Insert(&this->_bitmap,uVar8 & 0xffff);
  }
  return bVar5;
}

Assistant:

bool TimerContainer::InnerAddTimer(std::shared_ptr<TimerSlot> ptr, uint32_t time) {
    if (time > _timer_max) {
        return false;
    }
    
    uint16_t cur_index = time / _time_unit + _cur_time;
    if (cur_index >= _size) {
        cur_index -= _size;
    }
    uint32_t left_time = time % _time_unit;
    // don't have sub timer
    if (!_sub_timer) {
        left_time = 0;
    }
    ptr->SetCurIndex(cur_index, TimeUnit2TimeType(_time_unit));
    ptr->TimePass(time - left_time);

    _timer_wheel[cur_index][left_time].push_back(ptr);
    return _bitmap.Insert(cur_index);
}